

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_mike_2.h
# Opt level: O3

void __thiscall PlayerMike_2::~PlayerMike_2(PlayerMike_2 *this)

{
  pointer pfVar1;
  pointer pcVar2;
  
  (this->super_Player)._vptr_Player = (_func_int **)&PTR__PlayerMike_2_0010cb88;
  pfVar1 = (this->m_predictYou).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  pfVar1 = (this->m_predictMe).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  (this->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c820;
  pcVar2 = (this->super_Player).m_name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->super_Player).m_name.field_2) {
    operator_delete(pcVar2);
  }
  operator_delete(this);
  return;
}

Assistant:

PlayerMike_2(const std::string& name) :
      Player(name),
      m_histSize(2),
      m_predictMe(3),
      m_predictYou(3)
   {}